

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  OneHotEncoder *this_00;
  StringVector *pSVar1;
  Type *__x;
  int i;
  int index;
  
  this_00 = Specification::Model::mutable_onehotencoder
                      ((this->super_Model).m_spec.
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  index = 0;
  while( true ) {
    pSVar1 = Specification::OneHotEncoder::stringcategories(this_00);
    if ((pSVar1->vector_).super_RepeatedPtrFieldBase.current_size_ <= index) break;
    pSVar1 = Specification::OneHotEncoder::stringcategories(this_00);
    __x = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(pSVar1->vector_).super_RepeatedPtrFieldBase,index);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(container,__x);
    index = index + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<std::string>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->stringcategories().vector_size(); i++) {
            container.push_back(ohe->stringcategories().vector(i));
        }
        return Result();
    }